

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

size_t __thiscall cmListFileBacktrace::Depth(cmListFileBacktrace *this)

{
  size_t sVar1;
  Entry *pEVar2;
  
  pEVar2 = this->Cur;
  if (pEVar2 != (Entry *)0x0) {
    sVar1 = 0xffffffffffffffff;
    do {
      pEVar2 = pEVar2->Up;
      sVar1 = sVar1 + 1;
    } while (pEVar2 != (Entry *)0x0);
    return sVar1;
  }
  return 0;
}

Assistant:

size_t cmListFileBacktrace::Depth() const
{
  size_t depth = 0;
  if (this->Cur == CM_NULLPTR) {
    return 0;
  }

  for (Entry* i = this->Cur->Up; i; i = i->Up) {
    depth++;
  }
  return depth;
}